

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TablePopBackgroundChannel(void)

{
  ImGuiWindow *window;
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  
  window = GImGui->CurrentWindow;
  pIVar1 = GImGui->CurrentTable;
  pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,pIVar1->CurrentColumn);
  SetWindowClipRectBeforeSetChannel(window,&pIVar1->HostBackupInnerClipRect);
  ImDrawListSplitter::SetCurrentChannel
            (&pIVar1->DrawSplitter,window->DrawList,(uint)pIVar2->DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}